

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_celsius.cc
# Opt level: O3

void __thiscall hwtest::pgraph::MthdDmaClipid::emulate_mthd(MthdDmaClipid *this)

{
  pgraph_state *state;
  int iVar1;
  uint uVar2;
  uint32_t uVar3;
  uint uVar4;
  uint val;
  bool bVar5;
  uint uVar6;
  
  state = &(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp;
  pgraph_celsius_pre_icmd(state);
  iVar1 = (this->super_SingleMthdTest).super_MthdTest.super_StateTest.super_RepeatTest.super_Test.
          chipset.chipset;
  if (iVar1 < 4) {
    uVar4 = (uint)((this->super_SingleMthdTest).super_MthdTest.super_StateTest.super_RepeatTest.
                   super_Test.chipset.gpu == GPU_NV3T) << 0x16 | 0x3ffff0;
  }
  else {
    uVar4 = 0xfffff0;
    if (iVar1 != 4) {
      uVar2 = (this->super_SingleMthdTest).super_MthdTest.super_StateTest.super_RepeatTest.
              super_Test.chipset.card_type;
      uVar4 = 0x1fffff0;
      if (((0xf < (int)uVar2) && (uVar4 = 0x7fffff0, 0x1f < uVar2)) &&
         (uVar4 = 0x3fffffc0, iVar1 == 0x34)) {
        uVar4 = 0x3ffffff0;
      }
    }
  }
  uVar2 = (this->super_SingleMthdTest).super_MthdTest.pobj[0];
  uVar6 = uVar2 & 0xfff;
  val = (uVar2 >> 0x14 | (this->super_SingleMthdTest).super_MthdTest.pobj[2] & 0x3ffff000) &
        (uVar4 | 0xf);
  (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_surf_limit_clipid =
       (uint)(uVar6 != 0x30) << 0x1f |
       (uVar4 | 0xf) & (this->super_SingleMthdTest).super_MthdTest.pobj[1];
  (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_surf_base_clipid = val;
  pgraph_celsius_icmd(state,0x31,val,false);
  pgraph_celsius_icmd(state,0x32,
                      (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.
                      bundle_surf_limit_clipid,true);
  if ((uVar6 == 3) &&
     ((uVar3 = (this->super_SingleMthdTest).super_MthdTest.cls, uVar3 == 0x88 || (uVar3 == 0x38))))
  {
    bVar5 = false;
  }
  else {
    bVar5 = uVar6 != 0x30 && uVar6 != 0x3d;
    if ((((this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.debug_d >> 0x17 & 1) != 0)
       && ((uVar6 != 0x30 && (uVar6 != 0x3d)))) {
      nv04_pgraph_blowup(state,2);
    }
  }
  if ((uVar6 != 0x30) &&
     (((this->super_SingleMthdTest).super_MthdTest.pobj[0] & 0x30000) != 0 ||
      (uVar2 & 0x3f00000) != 0)) {
    nv04_pgraph_blowup(state,4);
  }
  uVar4 = 0;
  if ((uVar6 != 0x30) &&
     (uVar4 = (~(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.debug_d & 0x800000)
              << 5, !bVar5)) {
    uVar4 = 0x10000000;
  }
  (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.ctx_valid =
       (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.ctx_valid & 0xefffffff |
       uVar4;
  return;
}

Assistant:

void emulate_mthd() override {
		pgraph_celsius_pre_icmd(&exp);
		uint32_t offset_mask = pgraph_offset_mask(&chipset) | 0xf;
		uint32_t base = (pobj[2] & ~0xfff) | extr(pobj[0], 20, 12);
		uint32_t limit = pobj[1];
		uint32_t dcls = extr(pobj[0], 0, 12);
		exp.bundle_surf_limit_clipid = (limit & offset_mask) | (dcls != 0x30) << 31;
		exp.bundle_surf_base_clipid = base & offset_mask;
		pgraph_celsius_icmd(&exp, 0x31, exp.bundle_surf_base_clipid, false);
		pgraph_celsius_icmd(&exp, 0x32, exp.bundle_surf_limit_clipid, true);
		bool bad = true;
		if (dcls == 0x30 || dcls == 0x3d)
			bad = false;
		if (dcls == 3 && (cls == 0x38 || cls == 0x88))
			bad = false;
		if (extr(exp.debug_d, 23, 1) && bad) {
			nv04_pgraph_blowup(&exp, 0x2);
		}
		bool prot_err = false;
		if (extr(base, 0, 6))
			prot_err = true;
		if (extr(pobj[0], 16, 2))
			prot_err = true;
		if (dcls == 0x30)
			prot_err = false;
		if (prot_err)
			nv04_pgraph_blowup(&exp, 4);
		insrt(exp.ctx_valid, 28, 1, dcls != 0x30 && !(bad && extr(exp.debug_d, 23, 1)));
	}